

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bstrnicmp(bstring b0,bstring b1,int n)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  __int32_t **pp_Var10;
  uint uVar11;
  byte bVar12;
  uchar uVar13;
  ulong uVar14;
  ulong uVar15;
  
  iVar8 = -0x8000;
  iVar9 = -0x8000;
  if ((((b0 != (bstring)0x0) && (puVar5 = b0->data, iVar9 = iVar8, puVar5 != (uchar *)0x0)) &&
      (uVar3 = b0->slen, b1 != (bstring)0x0 && -1 < (int)uVar3)) &&
     ((puVar6 = b1->data, puVar6 != (uchar *)0x0 && (uVar4 = b1->slen, -1 < (int)(uVar4 | n))))) {
    uVar11 = n;
    if ((int)uVar3 < n) {
      uVar11 = uVar3;
    }
    if ((int)uVar4 <= (int)uVar11) {
      uVar11 = uVar4;
    }
    if (puVar5 == puVar6) {
LAB_00113e33:
      iVar9 = 0;
      if (uVar3 != uVar4 && uVar11 != n) {
        if ((int)uVar11 < (int)uVar3) {
          uVar13 = puVar5[(int)uVar11];
          if (-1 < (long)(char)uVar13) {
            pp_Var10 = __ctype_tolower_loc();
            uVar13 = (uchar)(*pp_Var10)[(char)uVar13];
          }
          iVar9 = 0x100;
          if (uVar13 != '\0') {
            iVar9 = (int)(char)uVar13;
          }
        }
        else {
          uVar13 = puVar6[(int)uVar11];
          if (-1 < (long)(char)uVar13) {
            pp_Var10 = __ctype_tolower_loc();
            uVar13 = (uchar)(*pp_Var10)[(char)uVar13];
            if (uVar13 == '\0') {
              return -0x100;
            }
          }
          iVar9 = -(int)(char)uVar13;
        }
      }
    }
    else {
      uVar15 = 0;
      uVar14 = 0;
      if (0 < (int)uVar11) {
        uVar14 = (ulong)uVar11;
      }
      do {
        if (uVar14 == uVar15) goto LAB_00113e33;
        bVar1 = puVar5[uVar15];
        bVar12 = bVar1;
        if (-1 < (long)(char)bVar1) {
          pp_Var10 = __ctype_tolower_loc();
          bVar12 = *(byte *)(*pp_Var10 + (char)bVar1);
        }
        bVar2 = puVar6[uVar15];
        bVar7 = bVar2;
        if (-1 < (long)(char)bVar2) {
          pp_Var10 = __ctype_tolower_loc();
          bVar7 = *(byte *)(*pp_Var10 + (char)bVar2);
        }
        uVar15 = uVar15 + 1;
      } while (bVar12 == bVar7);
      iVar9 = (uint)bVar1 - (uint)bVar2;
    }
  }
  return iVar9;
}

Assistant:

int bstrnicmp (const bstring b0, const bstring b1, int n) {
int i, v, m;

	if (bdata (b0) == NULL || b0->slen < 0 || 
	    bdata (b1) == NULL || b1->slen < 0 || n < 0) return SHRT_MIN;
	m = n;
	if (m > b0->slen) m = b0->slen;
	if (m > b1->slen) m = b1->slen;

	if (b0->data != b1->data) {
		for (i = 0; i < m; i ++) {
			v  = (char) downcase (b0->data[i]);
			v -= (char) downcase (b1->data[i]);
			if (v != 0) return b0->data[i] - b1->data[i];
		}
	}

	if (n == m || b0->slen == b1->slen) return 0;

	if (b0->slen > m) {
		v = (char) downcase (b0->data[m]);
		if (v) return v;
		return UCHAR_MAX + 1;
	}

	v = - (char) downcase (b1->data[m]);
	if (v) return v;
	return - (int) (UCHAR_MAX + 1);
}